

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long in_RSI;
  int in_EDI;
  int rv;
  stat st;
  int i;
  int c;
  Options opts;
  string *in_stack_000007e0;
  Options *in_stack_000007e8;
  string *in_stack_00001f68;
  Options *in_stack_00001f70;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [55];
  allocator local_d9;
  string *in_stack_ffffffffffffff28;
  Options *in_stack_ffffffffffffff30;
  stat local_b0;
  int local_1c;
  int local_18;
  Options local_13;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  Options::Options(&local_13);
  while (local_18 = getopt_long(local_8,local_10,"xjv",main::longOpts,0), local_18 != -1) {
    if (local_18 != 0) {
      if (local_18 == 0x6a) {
        local_13.json = true;
      }
      else if (local_18 == 0x76) {
        local_13.verbose = true;
      }
      else if (local_18 == 0x78) {
        local_13.extract = true;
      }
      else {
        if (local_18 != 0x1337) {
          exit(1);
        }
        usage((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
              (char **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
    }
  }
  local_1c = _optind;
  local_18 = 0xffffffff;
  while( true ) {
    if (local_8 <= local_1c) {
      return 0;
    }
    iVar2 = stat(*(char **)(local_10 + (long)local_1c * 8),&local_b0);
    __stream = _stderr;
    if (iVar2 < 0) break;
    if ((local_13.extract & 1U) == 0) {
      if ((local_13.json & 1U) == 0) {
        pcVar4 = *(char **)(local_10 + (long)local_1c * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_138,pcVar4,&local_139);
        iVar2 = dump(in_stack_000007e8,in_stack_000007e0);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      else {
        pcVar4 = *(char **)(local_10 + (long)local_1c * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,pcVar4,&local_111);
        iVar2 = json(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
    }
    else {
      pcVar4 = *(char **)(local_10 + (long)local_1c * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff28,pcVar4,&local_d9);
      iVar2 = extract(in_stack_00001f70,in_stack_00001f68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    local_1c = local_1c + 1;
  }
  uVar1 = *(undefined8 *)(local_10 + (long)local_1c * 8);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fprintf(__stream,"%s: %s\n",uVar1,pcVar4);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"extract", no_argument, nullptr, 'x'},
      {"json",    no_argument, nullptr, 'j'},
      {"verbose", no_argument, nullptr, 'v'},
      {"help",    no_argument, nullptr, 0x1337},
      {nullptr,   0,           nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "xjv", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 'x':
      opts.extract = true;
      break;
    case 'j':
      opts.json = true;
      break;
    case 'v':
      opts.verbose = true;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    default:
      exit(1);
    }
  }

  for (auto i = optind; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      fprintf(stderr, "%s: %s\n", argv[i], strerror(errno));
      exit(1);
    }
    if (opts.extract) {
      rv = extract(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    } else {
      if (opts.json) {
        rv = json(opts, argv[i]);
        if (rv != 0) {
          return rv;
        }
        continue;
      }
      rv = dump(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    }
  }

  return 0;
}